

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O3

errr Term_keypress(keycode_t k,uint8_t mods)

{
  undefined2 uVar1;
  term *ptVar2;
  uint16_t uVar3;
  
  if (k == 0) {
    return -1;
  }
  if (Term->complex_input == false) {
    switch(k) {
    case 8:
      k = 0x9f;
      break;
    case 9:
      k = 0x9d;
      break;
    case 10:
    case 0xd:
      k = 0x9c;
      break;
    case 0xb:
    case 0xc:
      break;
    default:
      if (k == 0x1b) {
        k = 0xe000;
      }
    }
  }
  Term->key_queue[Term->key_head].type = EVT_KBRD;
  *(keycode_t *)((long)Term->key_queue + (ulong)Term->key_head * 0xc + 4) = k;
  *(uint8_t *)((long)Term->key_queue + (ulong)Term->key_head * 0xc + 8) = mods;
  ptVar2 = Term;
  uVar1 = Term->key_head;
  uVar3 = 0;
  if ((uint16_t)(uVar1 + 1) != Term->key_size) {
    uVar3 = uVar1 + 1;
  }
  Term->key_head = uVar3;
  return (uint)(uVar3 == ptVar2->key_tail);
}

Assistant:

errr Term_keypress(keycode_t k, uint8_t mods)
{
	/* Hack -- Refuse to enqueue non-keys */
	if (!k) return (-1);

	if(!Term->complex_input) {
		switch (k)
		{
			case '\r':
			case '\n':
			  	k = KC_ENTER;
			  	break;
			case 8:
			  	k = KC_BACKSPACE;
			  	break;
			case 9:
			  	k = KC_TAB;
			  	break;
			case 27:
			  	k = ESCAPE;
			  	break;
		}
	}

	/* Store the char, advance the queue */
	Term->key_queue[Term->key_head].type = EVT_KBRD;
	Term->key_queue[Term->key_head].key.code = k;
	Term->key_queue[Term->key_head].key.mods = mods;
	Term->key_head++;

	/* Circular queue, handle wrap */
	if (Term->key_head == Term->key_size) Term->key_head = 0;

	/* Success (unless overflow) */
	if (Term->key_head != Term->key_tail) return (0);

	/* Problem */
	return (1);
}